

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseBuilder::comment(BaseBuilder *this,char *data,size_t size)

{
  BaseNode *in_RDX;
  BaseBuilder *in_RSI;
  long in_RDI;
  Error _err;
  CommentNode *node;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  Error local_4;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    local_4 = DebugUtils::errored(5);
  }
  else {
    local_4 = newCommentNode(in_RSI,(CommentNode **)in_RDX,in_stack_ffffffffffffffd8,
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (local_4 == 0) {
      addNode(in_RSI,in_RDX);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

Error BaseBuilder::comment(const char* data, size_t size) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  CommentNode* node;
  ASMJIT_PROPAGATE(newCommentNode(&node, data, size));
  ASMJIT_ASSUME(node != nullptr);

  addNode(node);
  return kErrorOk;
}